

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.c
# Opt level: O0

MPI_Comm createCommGrid(int *rank,int *dims)

{
  uint *in_RSI;
  int *in_RDI;
  int periods [2];
  int nproc;
  MPI_Comm Region;
  undefined1 local_24 [8];
  uint local_1c;
  MPI_Comm local_18;
  uint *local_10;
  int *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_24,0,8);
  local_10[1] = 0;
  *local_10 = 0;
  MPI_Comm_size(&ompi_mpi_comm_world,&local_1c);
  MPI_Dims_create(local_1c,2,local_10);
  MPI_Cart_create(&ompi_mpi_comm_world,2,local_10,local_24,1,&local_18);
  MPI_Comm_rank(local_18,local_8);
  if (*local_8 == 0) {
    printf("size: %i, dims: [%ix%i]\n",(ulong)local_1c,(ulong)*local_10,(ulong)local_10[1]);
  }
  return local_18;
}

Assistant:

MPI_Comm createCommGrid (int *rank, int *dims)
{
	MPI_Comm Region;
	int  nproc, periods[2] = {0,0};
	dims[0] = dims[1] = 0;
	MPI_Comm_size(MPI_COMM_WORLD,&nproc);
	MPI_Dims_create(nproc,2,dims);
	MPI_Cart_create(MPI_COMM_WORLD,2,dims,periods,1,&Region);
	MPI_Comm_rank(Region,rank);
	if (*rank == 0)
		printf("size: %i, dims: [%ix%i]\n",nproc,dims[0],dims[1]);
	return Region;
}